

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

void tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  int iVar1;
  int *piVar2;
  mz_uint16 mVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  ushort *puVar17;
  int iVar18;
  ushort uVar19;
  ushort *puVar20;
  long lVar21;
  ulong uVar22;
  ushort uVar23;
  long lVar24;
  ulong uVar25;
  ushort *puVar26;
  bool bVar27;
  int num_codes [33];
  mz_uint next_code [33];
  tdefl_sym_freq syms0 [288];
  tdefl_sym_freq syms1 [288];
  int local_15c8 [36];
  uint local_1538 [256];
  int local_1138 [256];
  ushort local_d38 [576];
  uint auStack_8b8 [256];
  ushort local_4b8 [580];
  
  uVar6 = (ulong)(uint)code_size_limit;
  memset(local_15c8,0,0x84);
  uVar25 = (ulong)(uint)table_len;
  if (static_table != 0) {
    if (0 < table_len) {
      uVar9 = 0;
      do {
        local_15c8[d->m_huff_code_sizes[(uint)table_num][uVar9]] =
             local_15c8[d->m_huff_code_sizes[(uint)table_num][uVar9]] + 1;
        uVar9 = uVar9 + 1;
      } while (uVar25 != uVar9);
    }
    goto LAB_003b7616;
  }
  if (table_len < 1) {
    memset(local_1538,0,0x800);
LAB_003b72c4:
    uVar9 = 0;
    bVar27 = true;
    local_1138[0] = 0;
  }
  else {
    uVar9 = 0;
    uVar15 = 0;
    do {
      mVar3 = d->m_huff_count[(uint)table_num][uVar9];
      if (mVar3 != 0) {
        lVar10 = (long)(int)uVar15;
        *(mz_uint16 *)(auStack_8b8 + lVar10 + -0x120) = mVar3;
        uVar15 = uVar15 + 1;
        *(short *)((long)auStack_8b8 + lVar10 * 4 + -0x47e) = (short)uVar9;
      }
      uVar9 = uVar9 + 1;
    } while (uVar25 != uVar9);
    memset(local_1538,0,0x800);
    bVar27 = uVar15 == 0;
    if (bVar27) goto LAB_003b72c4;
    uVar9 = 0;
    do {
      uVar14 = auStack_8b8[uVar9 - 0x120];
      local_1538[(byte)(ushort)uVar14] = local_1538[(byte)(ushort)uVar14] + 1;
      piVar2 = (int *)((long)local_1138 + (ulong)((ushort)((ushort)uVar14 >> 6) & 0xfffffffc));
      *piVar2 = *piVar2 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
    uVar9 = (ulong)uVar15;
  }
  iVar8 = (int)uVar9;
  lVar10 = 2;
  bVar5 = local_1138[0] == iVar8;
  do {
    bVar4 = bVar5;
    lVar24 = lVar10;
    bVar7 = 0;
    lVar10 = 1;
    bVar5 = false;
  } while (bVar4);
  puVar16 = local_1538;
  lVar10 = 0;
  puVar17 = local_4b8;
  puVar26 = local_d38;
  do {
    puVar20 = puVar17;
    lVar21 = 0;
    uVar15 = 0;
    do {
      auStack_8b8[lVar21] = uVar15;
      uVar15 = uVar15 + puVar16[lVar21];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x100);
    if (!bVar27) {
      uVar22 = 0;
      do {
        uVar14 = puVar26[uVar22 * 2] >> (bVar7 & 0x1f) & 0xff;
        uVar15 = auStack_8b8[uVar14];
        auStack_8b8[uVar14] = uVar15 + 1;
        *(undefined4 *)(puVar20 + (ulong)uVar15 * 2) = *(undefined4 *)(puVar26 + uVar22 * 2);
        uVar22 = uVar22 + 1;
      } while (uVar9 != uVar22);
    }
    lVar10 = lVar10 + 1;
    bVar7 = bVar7 + 8;
    puVar16 = puVar16 + 0x100;
    puVar17 = puVar26;
    puVar26 = puVar20;
  } while (lVar10 != lVar24);
  if (iVar8 != 0) {
    if (iVar8 == 1) {
      *puVar20 = 1;
    }
    else {
      *puVar20 = *puVar20 + puVar20[2];
      uVar15 = iVar8 - 1;
      if (iVar8 < 3) {
        puVar20[(long)iVar8 * 2 + -4] = 0;
      }
      else {
        iVar18 = 0;
        iVar12 = 2;
        uVar22 = 1;
        do {
          lVar10 = (long)iVar18;
          if ((iVar12 < iVar8) &&
             (lVar24 = (long)iVar12, puVar20[lVar24 * 2] <= puVar20[lVar10 * 2])) {
            iVar12 = iVar12 + 1;
            puVar20[uVar22 * 2] = puVar20[lVar24 * 2];
          }
          else {
            puVar20[uVar22 * 2] = puVar20[lVar10 * 2];
            iVar18 = iVar18 + 1;
            puVar20[lVar10 * 2] = (ushort)uVar22;
            lVar10 = (long)iVar18;
          }
          if (iVar12 < iVar8) {
            if (lVar10 < (long)uVar22) {
              uVar23 = puVar20[lVar10 * 2];
              uVar19 = puVar20[(long)iVar12 * 2];
              if (uVar23 < uVar19) goto LAB_003b741c;
            }
            else {
              uVar19 = puVar20[(long)iVar12 * 2];
            }
            iVar12 = iVar12 + 1;
            puVar20[uVar22 * 2] = puVar20[uVar22 * 2] + uVar19;
          }
          else {
            uVar23 = puVar20[lVar10 * 2];
LAB_003b741c:
            puVar20[uVar22 * 2] = puVar20[uVar22 * 2] + uVar23;
            iVar18 = iVar18 + 1;
            puVar20[lVar10 * 2] = (ushort)uVar22;
          }
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
        puVar20[(long)iVar8 * 2 + -4] = 0;
        uVar22 = (ulong)(iVar8 - 3);
        do {
          puVar20[uVar22 * 2] = puVar20[(ulong)puVar20[uVar22 * 2] * 2] + 1;
          bVar27 = uVar22 != 0;
          uVar22 = uVar22 - 1;
        } while (bVar27);
      }
      uVar14 = iVar8 - 2;
      iVar12 = 1;
      uVar13 = 0;
      do {
        if ((int)uVar14 < 0) {
          iVar18 = 0;
        }
        else {
          iVar1 = uVar14 + 1;
          iVar18 = 0;
          do {
            if (uVar13 != puVar20[(ulong)uVar14 * 2]) goto LAB_003b74b2;
            iVar18 = iVar18 + 1;
            uVar14 = uVar14 - 1;
          } while (iVar1 != iVar18);
          uVar14 = 0xffffffff;
          iVar18 = iVar1;
        }
LAB_003b74b2:
        if (iVar18 < iVar12) {
          puVar17 = puVar20 + (long)(int)uVar15 * 2;
          uVar15 = (uVar15 + iVar18) - iVar12;
          do {
            *puVar17 = (ushort)uVar13;
            iVar12 = iVar12 + -1;
            puVar17 = puVar17 + -2;
          } while (iVar18 < iVar12);
        }
        iVar12 = iVar18 * 2;
        uVar13 = uVar13 + 1;
      } while (iVar18 != 0);
      if (iVar8 < 1) goto LAB_003b758b;
    }
    uVar22 = 0;
    do {
      local_15c8[puVar20[uVar22 * 2]] = local_15c8[puVar20[uVar22 * 2]] + 1;
      uVar22 = uVar22 + 1;
    } while (uVar9 != uVar22);
    if (1 < iVar8) {
      if (code_size_limit < 0x20) {
        iVar8 = local_15c8[uVar6];
        lVar10 = (long)code_size_limit;
        do {
          iVar8 = iVar8 + local_15c8[lVar10 + 1];
          lVar10 = lVar10 + 1;
          local_15c8[uVar6] = iVar8;
        } while (lVar10 != 0x20);
        if (0 < code_size_limit) goto LAB_003b752d;
        uVar11 = 0;
      }
      else {
LAB_003b752d:
        uVar22 = uVar6 + 1;
        bVar7 = 0;
        uVar11 = 0;
        do {
          uVar11 = (ulong)(uint)((int)uVar11 + (local_15c8[uVar22 - 1] << (bVar7 & 0x1f)));
          uVar22 = uVar22 - 1;
          bVar7 = bVar7 + 1;
        } while (1 < uVar22);
      }
      for (; 1L << ((byte)code_size_limit & 0x3f) != uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
        local_15c8[uVar6] = local_15c8[uVar6] + -1;
        uVar22 = uVar6;
        do {
          if ((long)uVar22 < 2) goto LAB_003b7584;
          lVar10 = uVar22 - 1;
          uVar22 = uVar22 - 1;
        } while (local_15c8[lVar10] == 0);
        local_15c8[uVar22] = local_15c8[lVar10] + -1;
        local_15c8[(int)uVar22 + 1U & 0x7fffffff] = local_15c8[(int)uVar22 + 1U & 0x7fffffff] + 2;
LAB_003b7584:
      }
    }
  }
LAB_003b758b:
  memset(d->m_huff_code_sizes + (uint)table_num,0,0x120);
  memset(d->m_huff_codes + (uint)table_num,0,0x240);
  if (0 < code_size_limit) {
    uVar22 = 1;
    do {
      iVar8 = local_15c8[uVar22];
      if (0 < iVar8) {
        puVar17 = puVar20 + (long)(int)uVar9 * 2 + -1;
        uVar9 = (ulong)(uint)((int)uVar9 - iVar8);
        uVar15 = iVar8 + 1;
        do {
          d->m_huff_code_sizes[(uint)table_num][*puVar17] = (mz_uint8)uVar22;
          puVar17 = puVar17 + -2;
          uVar15 = uVar15 - 1;
        } while (1 < uVar15);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != code_size_limit + 1);
  }
LAB_003b7616:
  local_1538[1] = 0;
  if (1 < code_size_limit) {
    lVar10 = 0;
    uVar15 = 0;
    do {
      uVar15 = (uVar15 + local_15c8[lVar10 + 1]) * 2;
      local_1538[lVar10 + 2] = uVar15;
      lVar10 = lVar10 + 1;
    } while (uVar6 - 1 != lVar10);
  }
  if (0 < table_len) {
    uVar6 = 0;
    do {
      bVar7 = d->m_huff_code_sizes[(uint)table_num][uVar6];
      if (bVar7 != 0) {
        uVar14 = (uint)bVar7;
        uVar15 = local_1538[uVar14];
        local_1538[uVar14] = uVar15 + 1;
        uVar14 = uVar14 + 1;
        iVar8 = 0;
        do {
          iVar8 = (uVar15 & 1) + iVar8 * 2;
          uVar15 = uVar15 >> 1;
          uVar14 = uVar14 - 1;
        } while (1 < uVar14);
        d->m_huff_codes[(uint)table_num][uVar6] = (mz_uint16)iVar8;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar25);
  }
  return;
}

Assistant:

static void tdefl_optimize_huffman_table(tdefl_compressor *d, int table_num,
                                         int table_len, int code_size_limit,
                                         int static_table) {
  int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
  mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
  MZ_CLEAR_OBJ(num_codes);
  if (static_table) {
    for (i = 0; i < table_len; i++)
      num_codes[d->m_huff_code_sizes[table_num][i]]++;
  } else {
    tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS],
        *pSyms;
    int num_used_syms = 0;
    const mz_uint16 *pSym_count = &d->m_huff_count[table_num][0];
    for (i = 0; i < table_len; i++)
      if (pSym_count[i]) {
        syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
        syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
      }

    pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
    tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

    for (i = 0; i < num_used_syms; i++)
      num_codes[pSyms[i].m_key]++;

    tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms,
                                        code_size_limit);

    MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]);
    MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
    for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
      for (l = num_codes[i]; l > 0; l--)
        d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
  }

  next_code[1] = 0;
  for (j = 0, i = 2; i <= code_size_limit; i++)
    next_code[i] = j = ((j + num_codes[i - 1]) << 1);

  for (i = 0; i < table_len; i++) {
    mz_uint rev_code = 0, code, code_size;
    if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
      continue;
    code = next_code[code_size]++;
    for (l = code_size; l > 0; l--, code >>= 1)
      rev_code = (rev_code << 1) | (code & 1);
    d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
  }
}